

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86.cpp
# Opt level: O2

int __thiscall ncnn::DeformableConv2D_x86::create_pipeline(DeformableConv2D_x86 *this,Option *opt)

{
  uint uVar1;
  void *__ptr;
  size_t sVar2;
  Allocator *pAVar3;
  ulong uVar4;
  ulong uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  int iVar10;
  Mat *pMVar11;
  int iVar12;
  Layer *pLVar13;
  int *piVar14;
  int ic;
  int iVar15;
  ulong uVar16;
  undefined4 *puVar17;
  int i;
  ulong uVar18;
  int j;
  uint _h;
  ulong uVar19;
  _func_int **pp_Var20;
  int p;
  long lVar21;
  _func_int **pp_Var22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  _func_int **pp_Var27;
  undefined4 *puVar28;
  undefined4 *puVar29;
  ParamDict pd_5;
  ParamDict pd;
  undefined4 local_178;
  undefined4 uStack_174;
  int local_170;
  Allocator *local_168;
  int iStack_160;
  int iStack_15c;
  int iStack_158;
  int iStack_154;
  int local_150 [2];
  size_t local_148;
  void *local_140;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 local_130;
  undefined4 uStack_12c;
  int local_128;
  Allocator *local_120;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  int local_108;
  size_t local_100;
  undefined4 *local_f0;
  undefined4 *local_e8;
  ModelBinFromMatArray local_e0;
  uint local_cc;
  Mat local_c8;
  ulong local_80;
  ulong local_78;
  Mat *local_70;
  ulong local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  undefined4 *local_40;
  void *local_38;
  
  switch((this->super_DeformableConv2D).activation_type) {
  case 1:
    pLVar13 = create_layer_cpu(0x1a);
    ParamDict::ParamDict(&pd);
    (*pLVar13->_vptr_Layer[2])(pLVar13,&pd);
    break;
  case 2:
    pLVar13 = create_layer_cpu(0x1a);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_DeformableConv2D).activation_params.data);
    (*pLVar13->_vptr_Layer[2])(pLVar13,&pd);
    break;
  case 3:
    pLVar13 = create_layer_cpu(0x36);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_DeformableConv2D).activation_params.data);
    ParamDict::set(&pd,1,*(float *)((long)(this->super_DeformableConv2D).activation_params.data + 4)
                  );
    (*pLVar13->_vptr_Layer[2])(pLVar13,&pd);
    break;
  case 4:
    pLVar13 = create_layer_cpu(0x1e);
    ParamDict::ParamDict(&pd);
    (*pLVar13->_vptr_Layer[2])(pLVar13,&pd);
    break;
  case 5:
    pLVar13 = create_layer_cpu(0x47);
    ParamDict::ParamDict(&pd);
    (*pLVar13->_vptr_Layer[2])(pLVar13,&pd);
    break;
  case 6:
    pLVar13 = create_layer_cpu(0x43);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_DeformableConv2D).activation_params.data);
    ParamDict::set(&pd,1,*(float *)((long)(this->super_DeformableConv2D).activation_params.data + 4)
                  );
    (*pLVar13->_vptr_Layer[2])(pLVar13,&pd);
    break;
  default:
    pLVar13 = (Layer *)0x0;
    goto LAB_004f5b73;
  }
  ParamDict::~ParamDict(&pd);
  (*pLVar13->_vptr_Layer[4])(pLVar13,opt);
LAB_004f5b73:
  this->activation = pLVar13;
  iVar12 = (this->super_DeformableConv2D).kernel_w;
  local_78 = (ulong)iVar12;
  iVar15 = (this->super_DeformableConv2D).kernel_h;
  local_80 = (ulong)iVar15;
  _h = iVar15 * iVar12;
  uVar1 = (this->super_DeformableConv2D).num_output;
  uVar19 = (long)(this->super_DeformableConv2D).weight_data_size / (long)(int)_h;
  uVar19 = (ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 | uVar19 & 0xffffffff;
  uVar18 = (long)uVar19 / (long)(int)uVar1;
  iVar12 = (int)uVar18;
  if (opt->use_packing_layout == true) {
    uVar25 = (uint)((uVar18 & 3) == 0) * 3 + 1;
    uVar26 = (uint)((uVar1 & 3) == 0) * 3 + 1;
  }
  else {
    uVar25 = 1;
    uVar26 = uVar25;
  }
  if (opt->use_sgemm_convolution == true) {
    pLVar13 = create_layer_cpu(0x4a);
    this->gemm = pLVar13;
    ParamDict::ParamDict(&pd_5);
    ParamDict::set(&pd_5,2,0);
    ParamDict::set(&pd_5,3,0);
    ParamDict::set(&pd_5,4,1);
    ParamDict::set(&pd_5,5,0);
    ParamDict::set(&pd_5,6,1);
    ParamDict::set(&pd_5,7,(this->super_DeformableConv2D).num_output);
    ParamDict::set(&pd_5,8,0);
    ParamDict::set(&pd_5,9,iVar12 * _h);
    ParamDict::set(&pd_5,10,-(uint)((this->super_DeformableConv2D).bias_term == 0) | 1);
    ParamDict::set(&pd_5,0xb,1);
    (*this->gemm->_vptr_Layer[2])(this->gemm,&pd_5);
    local_c8.cstep = 0;
    local_c8.data = (_func_int **)0x0;
    local_c8.refcount._0_4_ = 0;
    local_c8.refcount._4_4_ = 0;
    local_c8.elemsize._0_4_ = 0;
    local_c8.elemsize._4_4_ = 0;
    local_c8.elempack = 0;
    local_c8.allocator = (Allocator *)0x0;
    local_c8.dims = 0;
    local_c8.w = 0;
    local_c8.h = 0;
    local_c8.d = 0;
    local_c8.c = 0;
    Mat::reshape((Mat *)&pd,&(this->super_DeformableConv2D).weight_data,_h,iVar12,
                 (this->super_DeformableConv2D).num_output,(Allocator *)0x0);
    uVar18 = 0;
    Mat::create(&local_c8,iVar12 * _h,(this->super_DeformableConv2D).num_output,4,(Allocator *)0x0);
    uVar1 = (this->super_DeformableConv2D).num_output;
    uVar19 = (ulong)_h;
    if ((int)_h < 1) {
      uVar19 = uVar18;
    }
    uVar23 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar23 = uVar18;
    }
    for (; uVar18 != uVar23; uVar18 = uVar18 + 1) {
      pp_Var20 = (_func_int **)
                 ((long)local_c8.w * CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize)
                  * uVar18 + (long)local_c8.data);
      for (lVar21 = 0; lVar21 < (long)((long)iVar12 - (ulong)(uVar25 - 1));
          lVar21 = lVar21 + (ulong)uVar25) {
        pp_Var22 = (_func_int **)
                   ((iStack_15c * lVar21 + local_148 * uVar18) * CONCAT44(uStack_174,local_178) +
                   (long)pd._vptr_ParamDict);
        for (uVar24 = 0; pp_Var27 = pp_Var22, uVar16 = (ulong)uVar25, uVar24 != uVar19;
            uVar24 = uVar24 + 1) {
          while (uVar16 != 0) {
            *(undefined4 *)pp_Var20 = *(undefined4 *)pp_Var27;
            pp_Var20 = (_func_int **)((long)pp_Var20 + 4);
            pp_Var27 = (_func_int **)
                       ((long)pp_Var27 + CONCAT44(uStack_174,local_178) * (long)iStack_15c);
            uVar16 = uVar16 - 1;
          }
          pp_Var22 = (_func_int **)((long)pp_Var22 + 4);
        }
      }
    }
    piVar14 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      if (*piVar14 == 0) {
        if (local_168 == (Allocator *)0x0) {
          free(pd._vptr_ParamDict);
        }
        else {
          (*local_168->_vptr_Allocator[3])();
        }
      }
    }
    if ((this->super_DeformableConv2D).bias_term == 0) {
      piVar14 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + 1;
        UNLOCK();
      }
      pd._vptr_ParamDict = (_func_int **)local_c8.data;
      pd.d._0_4_ = local_c8.refcount._0_4_;
      pd.d._4_4_ = local_c8.refcount._4_4_;
      uStack_174 = local_c8.elemsize._4_4_;
      local_170 = local_c8.elempack;
      local_168 = local_c8.allocator;
      iStack_160 = local_c8.dims;
      iStack_15c = local_c8.w;
      iStack_158 = local_c8.h;
      iStack_154 = local_c8.d;
      local_150[0] = local_c8.c;
      local_148 = local_c8.cstep;
      pLVar13 = this->gemm;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_e0,(Mat *)&pd);
      (*pLVar13->_vptr_Layer[3])(pLVar13,&local_e0);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_e0);
      piVar14 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (local_168 == (Allocator *)0x0) {
            free(pd._vptr_ParamDict);
          }
          else {
            (*local_168->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      piVar14 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + 1;
        UNLOCK();
      }
      local_100 = 0;
      local_108 = 0;
      uStack_10c = 0;
      uStack_110 = 0;
      uStack_114 = 0;
      uStack_118 = 0;
      local_120 = (Allocator *)0x0;
      local_128 = 0;
      uStack_12c = 0;
      local_130 = 0;
      uStack_134 = 0;
      uStack_138 = 0;
      local_140 = (void *)0x0;
      if ((Mat *)&local_140 != &(this->super_DeformableConv2D).bias_data) {
        piVar14 = (this->super_DeformableConv2D).bias_data.refcount;
        if (piVar14 != (int *)0x0) {
          LOCK();
          *piVar14 = *piVar14 + 1;
          UNLOCK();
        }
        local_140 = (this->super_DeformableConv2D).bias_data.data;
        piVar14 = (this->super_DeformableConv2D).bias_data.refcount;
        uStack_138 = SUB84(piVar14,0);
        uStack_134 = (undefined4)((ulong)piVar14 >> 0x20);
        sVar2 = (this->super_DeformableConv2D).bias_data.elemsize;
        local_130 = (undefined4)sVar2;
        uStack_12c = (undefined4)(sVar2 >> 0x20);
        local_128 = (this->super_DeformableConv2D).bias_data.elempack;
        local_120 = (this->super_DeformableConv2D).bias_data.allocator;
        uVar6 = (this->super_DeformableConv2D).bias_data.dims;
        uVar7 = (this->super_DeformableConv2D).bias_data.w;
        uVar8 = (this->super_DeformableConv2D).bias_data.h;
        uVar9 = (this->super_DeformableConv2D).bias_data.d;
        local_108 = (this->super_DeformableConv2D).bias_data.c;
        local_100 = (this->super_DeformableConv2D).bias_data.cstep;
        uStack_118 = uVar6;
        uStack_114 = uVar7;
        uStack_110 = uVar8;
        uStack_10c = uVar9;
      }
      local_148 = local_c8.cstep;
      local_150[0] = local_c8.c;
      iStack_154 = local_c8.d;
      iStack_158 = local_c8.h;
      iStack_15c = local_c8.w;
      iStack_160 = local_c8.dims;
      local_168 = local_c8.allocator;
      local_170 = local_c8.elempack;
      uStack_174 = local_c8.elemsize._4_4_;
      pd.d._4_4_ = local_c8.refcount._4_4_;
      pd.d._0_4_ = local_c8.refcount._0_4_;
      pd._vptr_ParamDict = (_func_int **)local_c8.data;
      pLVar13 = this->gemm;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_e0,(Mat *)&pd);
      (*pLVar13->_vptr_Layer[3])(pLVar13,&local_e0);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_e0);
      lVar21 = 0x48;
      do {
        piVar14 = *(int **)((long)&pd.d + lVar21);
        if (piVar14 != (int *)0x0) {
          LOCK();
          *piVar14 = *piVar14 + -1;
          UNLOCK();
          if (*piVar14 == 0) {
            if (*(long **)((long)&local_168 + lVar21) == (long *)0x0) {
              free(*(void **)((long)&pd._vptr_ParamDict + lVar21));
            }
            else {
              (**(code **)(**(long **)((long)&local_168 + lVar21) + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_148 + lVar21) = 0;
        *(undefined8 *)((long)&pd.d + lVar21 + 4) = 0;
        *(undefined8 *)((long)&uStack_174 + lVar21) = 0;
        *(undefined8 *)((long)&pd._vptr_ParamDict + lVar21) = 0;
        *(undefined8 *)((long)&pd.d + lVar21) = 0;
        *(undefined4 *)((long)local_150 + lVar21) = 0;
        *(undefined8 *)((long)&iStack_160 + lVar21) = 0;
        *(undefined8 *)((long)&iStack_158 + lVar21) = 0;
        lVar21 = lVar21 + -0x48;
      } while (lVar21 != -0x48);
    }
    (*this->gemm->_vptr_Layer[4])(this->gemm,opt);
    piVar14 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      if (*piVar14 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          free(local_c8.data);
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    ParamDict::~ParamDict(&pd_5);
  }
  else if ((uVar26 == 1) && (uVar25 == 1)) {
    piVar14 = (this->super_DeformableConv2D).weight_data.refcount;
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + 1;
      UNLOCK();
    }
    piVar14 = (this->weight_data_tm).refcount;
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      if (*piVar14 == 0) {
        __ptr = (this->weight_data_tm).data;
        pAVar3 = (this->weight_data_tm).allocator;
        if (pAVar3 == (Allocator *)0x0) {
          free(__ptr);
        }
        else {
          (*pAVar3->_vptr_Allocator[3])(pAVar3,__ptr,(long)uVar19 % (long)(int)uVar1 & 0xffffffff);
        }
      }
    }
    piVar14 = (this->super_DeformableConv2D).weight_data.refcount;
    (this->weight_data_tm).data = (this->super_DeformableConv2D).weight_data.data;
    (this->weight_data_tm).refcount = piVar14;
    (this->weight_data_tm).elemsize = (this->super_DeformableConv2D).weight_data.elemsize;
    (this->weight_data_tm).elempack = (this->super_DeformableConv2D).weight_data.elempack;
    (this->weight_data_tm).allocator = (this->super_DeformableConv2D).weight_data.allocator;
    iVar12 = (this->super_DeformableConv2D).weight_data.w;
    iVar15 = (this->super_DeformableConv2D).weight_data.h;
    iVar10 = (this->super_DeformableConv2D).weight_data.d;
    (this->weight_data_tm).dims = (this->super_DeformableConv2D).weight_data.dims;
    (this->weight_data_tm).w = iVar12;
    (this->weight_data_tm).h = iVar15;
    (this->weight_data_tm).d = iVar10;
    (this->weight_data_tm).c = (this->super_DeformableConv2D).weight_data.c;
    (this->weight_data_tm).cstep = (this->super_DeformableConv2D).weight_data.cstep;
  }
  else {
    local_70 = &this->weight_data_tm;
    local_f0 = (undefined4 *)(this->super_DeformableConv2D).weight_data.data;
    iVar15 = uVar25 * uVar26;
    Mat::create(local_70,(int)(iVar12 * _h * uVar1) / iVar15,(ulong)(uint)(iVar15 * 4),iVar15,
                (Allocator *)0x0);
    pMVar11 = local_70;
    uVar23 = 0;
    local_38 = (this->weight_data_tm).data;
    uVar19 = uVar18 & 0xffffffff;
    if (iVar12 < 1) {
      uVar19 = uVar23;
    }
    local_48 = 0;
    if (0 < (int)local_78) {
      local_48 = local_78 & 0xffffffff;
    }
    local_50 = 0;
    if (0 < (int)local_80) {
      local_50 = local_80 & 0xffffffff;
    }
    local_68 = 0;
    if (0 < (int)uVar1) {
      local_68 = (ulong)uVar1;
    }
    local_60 = local_78 * 4;
    puVar29 = local_f0;
    for (; puVar17 = puVar29, uVar23 != local_68; uVar23 = uVar23 + 1) {
      local_e8 = puVar17;
      for (uVar18 = 0; uVar18 != local_50; uVar18 = uVar18 + 1) {
        puVar29 = local_e8;
        for (uVar24 = 0; puVar28 = puVar29, uVar24 != local_48; uVar24 = uVar24 + 1) {
          puVar29 = puVar28;
          for (uVar16 = 0; uVar19 != uVar16; uVar16 = uVar16 + 1) {
            uVar4 = (ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 | uVar16 & 0xffffffff;
            uVar5 = (ulong)(uint)((int)uVar23 >> 0x1f) << 0x20 | uVar23 & 0xffffffff;
            *(undefined4 *)
             ((long)local_38 +
             (long)(int)((((((int)((long)uVar5 / (long)(int)uVar26) * (int)local_80 + (int)uVar18) *
                            (int)local_78 + (int)uVar24) * (iVar12 / (int)uVar25) +
                          (int)((long)uVar4 / (long)(int)uVar25)) * uVar25 +
                         (int)((long)uVar4 % (long)(int)uVar25)) * uVar26 +
                        (int)((long)uVar5 % (long)(int)uVar26)) * 4) = *puVar29;
            puVar29 = puVar29 + local_80 * local_78;
          }
          puVar29 = puVar28 + 1;
          local_40 = puVar28;
        }
        local_e8 = local_e8 + local_78;
      }
      puVar29 = puVar17 + (long)iVar12 * local_80 * local_78;
      local_f0 = puVar17;
    }
    local_cc = uVar1;
    local_58 = (ulong)_h;
    Mat::reshape((Mat *)&pd,local_70,iVar12 / (int)uVar25,_h,(int)uVar1 / (int)uVar26,
                 (Allocator *)0x0);
    piVar14 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
    if ((Mat *)&pd != pMVar11) {
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + 1;
        UNLOCK();
      }
      piVar14 = (this->weight_data_tm).refcount;
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          pAVar3 = (this->weight_data_tm).allocator;
          if (pAVar3 == (Allocator *)0x0) {
            free((this->weight_data_tm).data);
          }
          else {
            (*pAVar3->_vptr_Allocator[3])();
          }
        }
      }
      (this->weight_data_tm).data = pd._vptr_ParamDict;
      piVar14 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      (this->weight_data_tm).refcount = piVar14;
      (this->weight_data_tm).elemsize = CONCAT44(uStack_174,local_178);
      (this->weight_data_tm).elempack = local_170;
      (this->weight_data_tm).allocator = local_168;
      (this->weight_data_tm).dims = iStack_160;
      (this->weight_data_tm).w = iStack_15c;
      (this->weight_data_tm).h = iStack_158;
      (this->weight_data_tm).d = iStack_154;
      (this->weight_data_tm).c = local_150[0];
      (this->weight_data_tm).cstep = local_148;
    }
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      if (*piVar14 == 0) {
        if (local_168 == (Allocator *)0x0) {
          free(pd._vptr_ParamDict);
        }
        else {
          (*local_168->_vptr_Allocator[3])();
        }
      }
    }
  }
  if (opt->lightmode == true) {
    piVar14 = (this->super_DeformableConv2D).weight_data.refcount;
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      if (*piVar14 == 0) {
        pAVar3 = (this->super_DeformableConv2D).weight_data.allocator;
        if (pAVar3 == (Allocator *)0x0) {
          free((this->super_DeformableConv2D).weight_data.data);
        }
        else {
          (*pAVar3->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_DeformableConv2D).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_DeformableConv2D).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_DeformableConv2D).weight_data.elemsize + 4) = 0;
    (this->super_DeformableConv2D).weight_data.data = (void *)0x0;
    (this->super_DeformableConv2D).weight_data.refcount = (int *)0x0;
    (this->super_DeformableConv2D).weight_data.dims = 0;
    (this->super_DeformableConv2D).weight_data.w = 0;
    (this->super_DeformableConv2D).weight_data.h = 0;
    (this->super_DeformableConv2D).weight_data.d = 0;
    (this->super_DeformableConv2D).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int DeformableConv2D_x86::create_pipeline(const Option& opt)
{
    activation = create_activation_layer(activation_type, activation_params, opt);

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (opt.use_sgemm_convolution)
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer_cpu(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 0);                   // transA
        pd.set(3, 0);                   // transB
        pd.set(4, 1);                   // constantA
        pd.set(5, 0);                   // constantB
        pd.set(6, 1);                   // constantC
        pd.set(7, num_output);          // M = outch
        pd.set(8, 0);                   // N = size
        pd.set(9, maxk * num_input);    // K = maxk*inch
        pd.set(10, bias_term ? 1 : -1); // constant_broadcast_type_C = (M)
        pd.set(11, 1);                  // output_N1M

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-inch/pa-outch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_input, num_output);

            for (int q = 0; q < num_output; q += 1)
            {
                float* g00 = tmp.row(q);

                for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q).row(p + i);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = tmp;
            weights[1] = bias_data;

            gemm->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = tmp;

            gemm->load_model(ModelBinFromMatArray(weights));
        }

        gemm->create_pipeline(opt);
    }
    else if (elempack == 1 && out_elempack == 1)
    {
        weight_data_tm = weight_data;
    }
    else
    {
        deformableconv2d_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
    }

    if (opt.lightmode)
        weight_data.release();

    return 0;
}